

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::StreamingReporterBase::testGroupStarting(StreamingReporterBase *this,GroupInfo *_groupInfo)

{
  Option<Catch::GroupInfo> OStack_48;
  
  Option<Catch::GroupInfo>::Option(&OStack_48,_groupInfo);
  Option<Catch::GroupInfo>::operator=(&this->unusedGroupInfo,&OStack_48);
  Option<Catch::GroupInfo>::reset(&OStack_48);
  return;
}

Assistant:

virtual void testGroupStarting( GroupInfo const& _groupInfo ) {
            unusedGroupInfo = _groupInfo;
        }